

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushFunctionScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  bool bVar1;
  cmState *this_00;
  cmGlobalGenerator *this_01;
  cmFileLockPool *this_02;
  cmStateSnapshot local_38;
  PolicyMap *local_20;
  PolicyMap *pm_local;
  string *fileName_local;
  cmMakefile *this_local;
  
  local_20 = pm;
  pm_local = (PolicyMap *)fileName;
  fileName_local = (string *)this;
  this_00 = GetState(this);
  cmState::CreateFunctionCallSnapshot(&local_38,this_00,&this->StateSnapshot,(string *)pm_local);
  (this->StateSnapshot).State = local_38.State;
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  bVar1 = cmStateSnapshot::IsValid(&this->StateSnapshot);
  if (!bVar1) {
    __assert_fail("this->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x5dd,
                  "void cmMakefile::PushFunctionScope(const std::string &, const cmPolicies::PolicyMap &)"
                 );
  }
  PushLoopBlockBarrier(this);
  this_01 = GetGlobalGenerator(this);
  this_02 = cmGlobalGenerator::GetFileLockPool(this_01);
  cmFileLockPool::PushFunctionScope(this_02);
  PushFunctionBlockerBarrier(this);
  PushPolicy(this,true,local_20);
  return;
}

Assistant:

void cmMakefile::PushFunctionScope(std::string const& fileName,
                                   const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot = this->GetState()->CreateFunctionCallSnapshot(
    this->StateSnapshot, fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushLoopBlockBarrier();

#if !defined(CMAKE_BOOTSTRAP)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}